

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O0

void __thiscall CNetAddr::CNetAddr(CNetAddr *this,in_addr *ipv4Addr)

{
  long lVar1;
  prevector<16U,_unsigned_char,_unsigned_int,_int> *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  uint8_t *ptr;
  uchar *in_stack_ffffffffffffffb8;
  prevector<16U,_unsigned_char,_unsigned_int,_int> *in_stack_ffffffffffffffc8;
  uchar *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            (in_stack_ffffffffffffffc8,(size_type)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffffb8)
  ;
  *(undefined4 *)(in_RDI + 0x18) = 2;
  *(undefined4 *)(in_RDI + 0x1c) = 0;
  *(undefined4 *)(in_RDI + 0x18) = 1;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::assign<const_unsigned_char_*>
            (in_RSI,in_stack_ffffffffffffffd0,(uchar *)in_stack_ffffffffffffffc8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CNetAddr::CNetAddr(const struct in_addr& ipv4Addr)
{
    m_net = NET_IPV4;
    const uint8_t* ptr = reinterpret_cast<const uint8_t*>(&ipv4Addr);
    m_addr.assign(ptr, ptr + ADDR_IPV4_SIZE);
}